

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O0

bool __thiscall tcmalloc::Logger::AddStr(Logger *this,char *str,int n)

{
  bool bVar1;
  int n_local;
  char *str_local;
  Logger *this_local;
  
  bVar1 = (long)n <= (long)this->end_ - (long)this->p_;
  if (bVar1) {
    memcpy(this->p_,str,(long)n);
    this->p_ = this->p_ + n;
  }
  return bVar1;
}

Assistant:

bool Logger::AddStr(const char* str, int n) {
  if (end_ - p_ < n) {
    return false;
  } else {
    memcpy(p_, str, n);
    p_ += n;
    return true;
  }
}